

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_alltoallw_(void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Fint *sendtypes,
                      void *recvbuf,int *recvcounts,int *rdispls,MPIABI_Fint *recvtypes,
                      MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  int *recvcounts_local;
  void *recvbuf_local;
  MPIABI_Fint *sendtypes_local;
  int *sdispls_local;
  int *sendcounts_local;
  void *sendbuf_local;
  
  mpi_alltoallw_(sendbuf,sendcounts,sdispls,sendtypes,recvbuf,recvcounts,rdispls,recvtypes,comm,
                 ierror);
  return;
}

Assistant:

void mpiabi_alltoallw_(
  const void * sendbuf,
  const int * sendcounts,
  const int * sdispls,
  const MPIABI_Fint * sendtypes,
  void * recvbuf,
  const int * recvcounts,
  const int * rdispls,
  const MPIABI_Fint * recvtypes,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_alltoallw_(
    sendbuf,
    sendcounts,
    sdispls,
    sendtypes,
    recvbuf,
    recvcounts,
    rdispls,
    recvtypes,
    comm,
    ierror
  );
}